

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tutorial.cpp
# Opt level: O0

void __thiscall
embree::TutorialApplication::TutorialApplication
          (TutorialApplication *this,string *tutorialName,int features,int w,int h)

{
  undefined4 in_ECX;
  string *in_RSI;
  undefined8 *in_RDI;
  undefined4 in_R8D;
  double dVar1;
  string *in_stack_fffffffffffff5d8;
  unique_ptr<embree::ISPCScene,_std::default_delete<embree::ISPCScene>_> *in_stack_fffffffffffff5e0;
  allocator *paVar2;
  string *in_stack_fffffffffffff5e8;
  string *name;
  Application *in_stack_fffffffffffff5f0;
  Application *this_00;
  char *in_stack_fffffffffffff628;
  FileName *in_stack_fffffffffffff630;
  allocator local_851;
  string local_850 [47];
  undefined1 local_821 [40];
  undefined1 local_7f9 [48];
  allocator local_7c9;
  string local_7c8 [39];
  allocator local_7a1;
  string local_7a0 [47];
  allocator local_771;
  string local_770 [39];
  allocator local_749;
  string local_748 [47];
  allocator local_719;
  string local_718 [39];
  allocator local_6f1;
  string local_6f0 [47];
  allocator local_6c1;
  string local_6c0 [39];
  allocator local_699;
  string local_698 [47];
  allocator local_669;
  string local_668 [39];
  allocator local_641;
  string local_640 [47];
  allocator local_611;
  string local_610 [39];
  allocator local_5e9;
  string local_5e8 [47];
  allocator local_5b9;
  string local_5b8 [39];
  allocator local_591;
  string local_590 [28];
  int in_stack_fffffffffffffa8c;
  Application *in_stack_fffffffffffffa90;
  allocator local_561;
  string local_560 [39];
  allocator local_539;
  string local_538 [47];
  allocator local_509;
  string local_508 [39];
  allocator local_4e1;
  string local_4e0 [47];
  allocator local_4b1;
  string local_4b0 [39];
  allocator local_489;
  string local_488 [47];
  allocator local_459;
  string local_458 [39];
  allocator local_431;
  string local_430 [47];
  allocator local_401;
  string local_400 [39];
  allocator local_3d9;
  string local_3d8 [47];
  allocator local_3a9;
  string local_3a8 [39];
  allocator local_381;
  string local_380 [47];
  allocator local_351;
  string local_350 [39];
  allocator local_329;
  string local_328 [47];
  allocator local_2f9;
  string local_2f8 [39];
  allocator local_2d1;
  string local_2d0 [47];
  allocator local_2a1;
  string local_2a0 [39];
  allocator local_279;
  string local_278 [47];
  allocator local_249;
  string local_248 [39];
  allocator local_221;
  string local_220 [47];
  allocator local_1f1;
  string local_1f0 [39];
  allocator local_1c9;
  string local_1c8 [47];
  allocator local_199;
  string local_198 [39];
  allocator local_171;
  string local_170 [47];
  allocator local_141;
  string local_140 [39];
  allocator local_119;
  string local_118 [47];
  allocator local_e9;
  string local_e8 [39];
  allocator local_c1;
  string local_c0 [47];
  allocator local_91;
  string local_90 [32];
  uint local_70;
  uint local_6c;
  uint local_68;
  uint local_64;
  undefined4 local_4c;
  undefined4 local_48;
  string *local_40;
  undefined8 *local_30;
  undefined4 *local_28;
  undefined1 *local_18;
  undefined1 *local_10;
  undefined1 *local_8;
  
  local_4c = in_R8D;
  local_48 = in_ECX;
  local_40 = in_RSI;
  Application::Application(in_stack_fffffffffffffa90,in_stack_fffffffffffffa8c);
  *in_RDI = &PTR__TutorialApplication_005fc8d8;
  in_RDI[0x15] = 0;
  std::__cxx11::string::string((string *)(in_RDI + 0x16),local_40);
  local_30 = in_RDI + 0x1a;
  *local_30 = 0;
  Camera::Camera((Camera *)(in_RDI + 0x1c));
  *(undefined4 *)(in_RDI + 0x24) = local_48;
  *(undefined4 *)((long)in_RDI + 0x124) = local_4c;
  in_RDI[0x25] = 0;
  embree::FileName::FileName(in_stack_fffffffffffff630,in_stack_fffffffffffff628);
  embree::FileName::FileName(in_stack_fffffffffffff630,in_stack_fffffffffffff628);
  *(undefined4 *)(in_RDI + 0x2e) = 0x420c0000;
  *(undefined4 *)((long)in_RDI + 0x174) = 1;
  *(undefined1 *)(in_RDI + 0x2f) = 1;
  *(undefined1 *)((long)in_RDI + 0x179) = 0;
  *(undefined4 *)((long)in_RDI + 0x17c) = 0x400;
  *(undefined4 *)(in_RDI + 0x30) = 0x400;
  dVar1 = getSeconds();
  in_RDI[0x31] = dVar1;
  *(undefined4 *)(in_RDI + 0x32) = 0;
  *(undefined4 *)((long)in_RDI + 0x194) = 0;
  *(undefined4 *)(in_RDI + 0x33) = 0;
  in_RDI[0x34] = 0;
  in_RDI[0x35] = 0;
  *(undefined4 *)(in_RDI + 0x36) = 0x3f800000;
  local_28 = (undefined4 *)((long)in_RDI + 0x1b4);
  local_8 = &embree::zero;
  *local_28 = 0;
  local_10 = &embree::zero;
  *(undefined4 *)(in_RDI + 0x37) = 0;
  local_18 = &embree::zero;
  *(undefined4 *)((long)in_RDI + 0x1bc) = 0;
  *(undefined1 *)(in_RDI + 0x38) = 1;
  *(undefined4 *)((long)in_RDI + 0x1c4) = 0;
  *(undefined1 *)(in_RDI + 0x39) = 0;
  *(undefined1 *)((long)in_RDI + 0x1c9) = 0;
  Averaged<double>::Averaged
            ((Averaged<double> *)in_stack_fffffffffffff5f0,(size_t)in_stack_fffffffffffff5e8,
             (double)in_stack_fffffffffffff5e0);
  Averaged<double>::Averaged
            ((Averaged<double> *)in_stack_fffffffffffff5f0,(size_t)in_stack_fffffffffffff5e8,
             (double)in_stack_fffffffffffff5e0);
  Averaged<double>::Averaged
            ((Averaged<double> *)in_stack_fffffffffffff5f0,(size_t)in_stack_fffffffffffff5e8,
             (double)in_stack_fffffffffffff5e0);
  *(undefined1 *)(in_RDI + 0x5e) = 0;
  *(undefined4 *)((long)in_RDI + 0x2f4) = 0;
  *(undefined4 *)(in_RDI + 0x5f) = 0;
  *(undefined4 *)((long)in_RDI + 0x2fc) = 0;
  *(undefined4 *)(in_RDI + 0x60) = 0;
  *(undefined4 *)((long)in_RDI + 0x304) = 0x10000;
  *(undefined4 *)(in_RDI + 0x61) = 0;
  std::unique_ptr<embree::ISPCScene,std::default_delete<embree::ISPCScene>>::
  unique_ptr<std::default_delete<embree::ISPCScene>,void>(in_stack_fffffffffffff5e0);
  local_64 = MXCSR;
  local_6c = MXCSR | 0x8000;
  MXCSR = MXCSR | 0x8040;
  instance = in_RDI;
  local_70 = MXCSR;
  local_68 = local_6c;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_90,"c",&local_91);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_c0,"-c <filename>: parses command line option from <filename>",&local_c1);
  Application::
  registerOption<embree::TutorialApplication::TutorialApplication(std::__cxx11::string_const&,int,int,int)::__0>
            (in_stack_fffffffffffff5f0,in_stack_fffffffffffff5e8,
             (anon_class_8_1_8991fb9c_for_f *)in_stack_fffffffffffff5e0,in_stack_fffffffffffff5d8);
  std::__cxx11::string::~string(local_c0);
  std::allocator<char>::~allocator((allocator<char> *)&local_c1);
  std::__cxx11::string::~string(local_90);
  std::allocator<char>::~allocator((allocator<char> *)&local_91);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_e8,"o",&local_e9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_118,"-o <filename>: output image filename",&local_119);
  Application::
  registerOption<embree::TutorialApplication::TutorialApplication(std::__cxx11::string_const&,int,int,int)::__1>
            (in_stack_fffffffffffff5f0,in_stack_fffffffffffff5e8,
             (anon_class_8_1_8991fb9c_for_f *)in_stack_fffffffffffff5e0,in_stack_fffffffffffff5d8);
  std::__cxx11::string::~string(local_118);
  std::allocator<char>::~allocator((allocator<char> *)&local_119);
  std::__cxx11::string::~string(local_e8);
  std::allocator<char>::~allocator((allocator<char> *)&local_e9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_140,"compare",&local_141);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_170,"--compare <filename>: reference image to compare against",&local_171);
  Application::
  registerOption<embree::TutorialApplication::TutorialApplication(std::__cxx11::string_const&,int,int,int)::__2>
            (in_stack_fffffffffffff5f0,in_stack_fffffffffffff5e8,
             (anon_class_8_1_8991fb9c_for_f *)in_stack_fffffffffffff5e0,in_stack_fffffffffffff5d8);
  std::__cxx11::string::~string(local_170);
  std::allocator<char>::~allocator((allocator<char> *)&local_171);
  std::__cxx11::string::~string(local_140);
  std::allocator<char>::~allocator((allocator<char> *)&local_141);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_198,"compare-threshold",&local_199);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_1c8,
             "--compare-threshold <float>: threshold in number of wrong pixels when image is considered wrong"
             ,&local_1c9);
  Application::
  registerOption<embree::TutorialApplication::TutorialApplication(std::__cxx11::string_const&,int,int,int)::__3>
            (in_stack_fffffffffffff5f0,in_stack_fffffffffffff5e8,
             (anon_class_8_1_8991fb9c_for_f *)in_stack_fffffffffffff5e0,in_stack_fffffffffffff5d8);
  std::__cxx11::string::~string(local_1c8);
  std::allocator<char>::~allocator((allocator<char> *)&local_1c9);
  std::__cxx11::string::~string(local_198);
  std::allocator<char>::~allocator((allocator<char> *)&local_199);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1f0,"frames",&local_1f1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_220,"--frames <int>: number of frames to render in compare or output mode",
             &local_221);
  Application::
  registerOption<embree::TutorialApplication::TutorialApplication(std::__cxx11::string_const&,int,int,int)::__4>
            (in_stack_fffffffffffff5f0,in_stack_fffffffffffff5e8,
             (anon_class_8_1_8991fb9c_for_f *)in_stack_fffffffffffff5e0,in_stack_fffffffffffff5d8);
  std::__cxx11::string::~string(local_220);
  std::allocator<char>::~allocator((allocator<char> *)&local_221);
  std::__cxx11::string::~string(local_1f0);
  std::allocator<char>::~allocator((allocator<char> *)&local_1f1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_248,"vp",&local_249);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_278,"--vp <float> <float> <float>: camera position",&local_279)
  ;
  Application::
  registerOption<embree::TutorialApplication::TutorialApplication(std::__cxx11::string_const&,int,int,int)::__5>
            (in_stack_fffffffffffff5f0,in_stack_fffffffffffff5e8,
             (anon_class_8_1_8991fb9c_for_f *)in_stack_fffffffffffff5e0,in_stack_fffffffffffff5d8);
  std::__cxx11::string::~string(local_278);
  std::allocator<char>::~allocator((allocator<char> *)&local_279);
  std::__cxx11::string::~string(local_248);
  std::allocator<char>::~allocator((allocator<char> *)&local_249);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_2a0,"vi",&local_2a1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_2d0,"--vi <float> <float> <float>: camera lookat position",&local_2d1);
  Application::
  registerOption<embree::TutorialApplication::TutorialApplication(std::__cxx11::string_const&,int,int,int)::__6>
            (in_stack_fffffffffffff5f0,in_stack_fffffffffffff5e8,
             (anon_class_8_1_8991fb9c_for_f *)in_stack_fffffffffffff5e0,in_stack_fffffffffffff5d8);
  std::__cxx11::string::~string(local_2d0);
  std::allocator<char>::~allocator((allocator<char> *)&local_2d1);
  std::__cxx11::string::~string(local_2a0);
  std::allocator<char>::~allocator((allocator<char> *)&local_2a1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_2f8,"vd",&local_2f9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_328,"--vd <float> <float> <float>: camera direction vector",&local_329);
  Application::
  registerOption<embree::TutorialApplication::TutorialApplication(std::__cxx11::string_const&,int,int,int)::__7>
            (in_stack_fffffffffffff5f0,in_stack_fffffffffffff5e8,
             (anon_class_8_1_8991fb9c_for_f *)in_stack_fffffffffffff5e0,in_stack_fffffffffffff5d8);
  std::__cxx11::string::~string(local_328);
  std::allocator<char>::~allocator((allocator<char> *)&local_329);
  std::__cxx11::string::~string(local_2f8);
  std::allocator<char>::~allocator((allocator<char> *)&local_2f9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_350,"vu",&local_351);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_380,"--vu <float> <float> <float>: camera up vector",&local_381);
  Application::
  registerOption<embree::TutorialApplication::TutorialApplication(std::__cxx11::string_const&,int,int,int)::__8>
            (in_stack_fffffffffffff5f0,in_stack_fffffffffffff5e8,
             (anon_class_8_1_8991fb9c_for_f *)in_stack_fffffffffffff5e0,in_stack_fffffffffffff5d8);
  std::__cxx11::string::~string(local_380);
  std::allocator<char>::~allocator((allocator<char> *)&local_381);
  std::__cxx11::string::~string(local_350);
  std::allocator<char>::~allocator((allocator<char> *)&local_351);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_3a8,"fov",&local_3a9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_3d8,"--fov <float>: vertical field of view",&local_3d9);
  Application::
  registerOption<embree::TutorialApplication::TutorialApplication(std::__cxx11::string_const&,int,int,int)::__9>
            (in_stack_fffffffffffff5f0,in_stack_fffffffffffff5e8,
             (anon_class_8_1_8991fb9c_for_f *)in_stack_fffffffffffff5e0,in_stack_fffffffffffff5d8);
  std::__cxx11::string::~string(local_3d8);
  std::allocator<char>::~allocator((allocator<char> *)&local_3d9);
  std::__cxx11::string::~string(local_3a8);
  std::allocator<char>::~allocator((allocator<char> *)&local_3a9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_400,"lefthanded",&local_401);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_430,"--lefthanded: use left handed coordinates",&local_431);
  Application::
  registerOption<embree::TutorialApplication::TutorialApplication(std::__cxx11::string_const&,int,int,int)::__10>
            (in_stack_fffffffffffff5f0,in_stack_fffffffffffff5e8,
             (anon_class_8_1_8991fb9c_for_f *)in_stack_fffffffffffff5e0,in_stack_fffffffffffff5d8);
  std::__cxx11::string::~string(local_430);
  std::allocator<char>::~allocator((allocator<char> *)&local_431);
  std::__cxx11::string::~string(local_400);
  std::allocator<char>::~allocator((allocator<char> *)&local_401);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_458,"righthanded",&local_459);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_488,"--righthanded: use right handed coordinates",&local_489);
  Application::
  registerOption<embree::TutorialApplication::TutorialApplication(std::__cxx11::string_const&,int,int,int)::__11>
            (in_stack_fffffffffffff5f0,in_stack_fffffffffffff5e8,
             (anon_class_8_1_8991fb9c_for_f *)in_stack_fffffffffffff5e0,in_stack_fffffffffffff5d8);
  std::__cxx11::string::~string(local_488);
  std::allocator<char>::~allocator((allocator<char> *)&local_489);
  std::__cxx11::string::~string(local_458);
  std::allocator<char>::~allocator((allocator<char> *)&local_459);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_4b0,"size",&local_4b1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_4e0,"--size <width> <height>: sets image size",&local_4e1);
  Application::
  registerOption<embree::TutorialApplication::TutorialApplication(std::__cxx11::string_const&,int,int,int)::__12>
            (in_stack_fffffffffffff5f0,in_stack_fffffffffffff5e8,
             (anon_class_8_1_8991fb9c_for_f *)in_stack_fffffffffffff5e0,in_stack_fffffffffffff5d8);
  std::__cxx11::string::~string(local_4e0);
  std::allocator<char>::~allocator((allocator<char> *)&local_4e1);
  std::__cxx11::string::~string(local_4b0);
  std::allocator<char>::~allocator((allocator<char> *)&local_4b1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_508,"fullscreen",&local_509);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_538,"--fullscreen: starts in fullscreen mode",&local_539);
  Application::
  registerOption<embree::TutorialApplication::TutorialApplication(std::__cxx11::string_const&,int,int,int)::__13>
            (in_stack_fffffffffffff5f0,in_stack_fffffffffffff5e8,
             (anon_class_8_1_8991fb9c_for_f *)in_stack_fffffffffffff5e0,in_stack_fffffffffffff5d8);
  std::__cxx11::string::~string(local_538);
  std::allocator<char>::~allocator((allocator<char> *)&local_539);
  std::__cxx11::string::~string(local_508);
  std::allocator<char>::~allocator((allocator<char> *)&local_509);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_560,"print-frame-rate",&local_561);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_590,"--print-frame-rate: prints framerate for each frame on console",&local_591);
  Application::
  registerOption<embree::TutorialApplication::TutorialApplication(std::__cxx11::string_const&,int,int,int)::__14>
            (in_stack_fffffffffffff5f0,in_stack_fffffffffffff5e8,
             (anon_class_8_1_8991fb9c_for_f *)in_stack_fffffffffffff5e0,in_stack_fffffffffffff5d8);
  std::__cxx11::string::~string(local_590);
  std::allocator<char>::~allocator((allocator<char> *)&local_591);
  std::__cxx11::string::~string(local_560);
  std::allocator<char>::~allocator((allocator<char> *)&local_561);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_5b8,"print-camera",&local_5b9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_5e8,"--print-camera: prints camera for each frame on console",&local_5e9);
  Application::
  registerOption<embree::TutorialApplication::TutorialApplication(std::__cxx11::string_const&,int,int,int)::__15>
            (in_stack_fffffffffffff5f0,in_stack_fffffffffffff5e8,
             (anon_class_8_1_8991fb9c_for_f *)in_stack_fffffffffffff5e0,in_stack_fffffffffffff5d8);
  std::__cxx11::string::~string(local_5e8);
  std::allocator<char>::~allocator((allocator<char> *)&local_5e9);
  std::__cxx11::string::~string(local_5b8);
  std::allocator<char>::~allocator((allocator<char> *)&local_5b9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_610,"debug0",&local_611);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_640,"--debug0: sets internal debugging value",&local_641);
  Application::
  registerOption<embree::TutorialApplication::TutorialApplication(std::__cxx11::string_const&,int,int,int)::__16>
            (in_stack_fffffffffffff5f0,in_stack_fffffffffffff5e8,
             (anon_class_8_1_8991fb9c_for_f *)in_stack_fffffffffffff5e0,in_stack_fffffffffffff5d8);
  std::__cxx11::string::~string(local_640);
  std::allocator<char>::~allocator((allocator<char> *)&local_641);
  std::__cxx11::string::~string(local_610);
  std::allocator<char>::~allocator((allocator<char> *)&local_611);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_668,"debug1",&local_669);
  paVar2 = &local_699;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_698,"--debug1: sets internal debugging value",paVar2);
  Application::
  registerOption<embree::TutorialApplication::TutorialApplication(std::__cxx11::string_const&,int,int,int)::__17>
            (in_stack_fffffffffffff5f0,in_stack_fffffffffffff5e8,
             (anon_class_8_1_8991fb9c_for_f *)in_stack_fffffffffffff5e0,in_stack_fffffffffffff5d8);
  std::__cxx11::string::~string(local_698);
  std::allocator<char>::~allocator((allocator<char> *)&local_699);
  std::__cxx11::string::~string(local_668);
  std::allocator<char>::~allocator((allocator<char> *)&local_669);
  paVar2 = &local_6c1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_6c0,"debug2",paVar2);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_6f0,"--debug2: sets internal debugging value",&local_6f1);
  Application::
  registerOption<embree::TutorialApplication::TutorialApplication(std::__cxx11::string_const&,int,int,int)::__18>
            (in_stack_fffffffffffff5f0,in_stack_fffffffffffff5e8,
             (anon_class_8_1_8991fb9c_for_f *)in_stack_fffffffffffff5e0,in_stack_fffffffffffff5d8);
  std::__cxx11::string::~string(local_6f0);
  std::allocator<char>::~allocator((allocator<char> *)&local_6f1);
  std::__cxx11::string::~string(local_6c0);
  std::allocator<char>::~allocator((allocator<char> *)&local_6c1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_718,"debug3",&local_719);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_748,"--debug3: sets internal debugging value",&local_749);
  Application::
  registerOption<embree::TutorialApplication::TutorialApplication(std::__cxx11::string_const&,int,int,int)::__19>
            (in_stack_fffffffffffff5f0,in_stack_fffffffffffff5e8,
             (anon_class_8_1_8991fb9c_for_f *)in_stack_fffffffffffff5e0,in_stack_fffffffffffff5d8);
  std::__cxx11::string::~string(local_748);
  std::allocator<char>::~allocator((allocator<char> *)&local_749);
  std::__cxx11::string::~string(local_718);
  std::allocator<char>::~allocator((allocator<char> *)&local_719);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_770,"time",&local_771);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_7a0,"--time: sets time for motion blur",&local_7a1);
  Application::
  registerOption<embree::TutorialApplication::TutorialApplication(std::__cxx11::string_const&,int,int,int)::__20>
            (in_stack_fffffffffffff5f0,in_stack_fffffffffffff5e8,
             (anon_class_8_1_8991fb9c_for_f *)in_stack_fffffffffffff5e0,in_stack_fffffffffffff5d8);
  std::__cxx11::string::~string(local_7a0);
  std::allocator<char>::~allocator((allocator<char> *)&local_7a1);
  std::__cxx11::string::~string(local_770);
  std::allocator<char>::~allocator((allocator<char> *)&local_771);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_7c8,"coherent",&local_7c9);
  this_00 = (Application *)local_7f9;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)(local_7f9 + 1),
             "--coherent: force using RTC_RAY_QUERY_FLAG_COHERENT hint when tracing rays",
             (allocator *)this_00);
  Application::
  registerOption<embree::TutorialApplication::TutorialApplication(std::__cxx11::string_const&,int,int,int)::__21>
            (this_00,in_stack_fffffffffffff5e8,
             (anon_class_8_1_8991fb9c_for_f *)in_stack_fffffffffffff5e0,in_stack_fffffffffffff5d8);
  std::__cxx11::string::~string((string *)(local_7f9 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_7f9);
  std::__cxx11::string::~string(local_7c8);
  std::allocator<char>::~allocator((allocator<char> *)&local_7c9);
  name = (string *)local_821;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)(local_821 + 1),"incoherent",(allocator *)name);
  paVar2 = &local_851;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_850,
             "--incoherent: force using RTC_RAY_QUERY_FLAG_INCOHERENT hint when tracing rays",paVar2
            );
  Application::
  registerOption<embree::TutorialApplication::TutorialApplication(std::__cxx11::string_const&,int,int,int)::__22>
            (this_00,name,(anon_class_8_1_8991fb9c_for_f *)paVar2,in_stack_fffffffffffff5d8);
  std::__cxx11::string::~string(local_850);
  std::allocator<char>::~allocator((allocator<char> *)&local_851);
  std::__cxx11::string::~string((string *)(local_821 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_821);
  return;
}

Assistant:

TutorialApplication::TutorialApplication (const std::string& tutorialName, int features, int w, int h)

    : Application(features),
      tutorialName(tutorialName),

      width(w),
      height(h),
      pixels(nullptr),

      outputImageFilename(""),
      referenceImageFilename(""),
      referenceImageThreshold(35.0f),

      interactive(true),
      fullscreen(false),

      window_width(1024),
      window_height(1024),

      time0(getSeconds()),
      debug_int0(0),
      debug_int1(0),

      mouseMode(0),
      clickX(0.0), clickY(0.0),
      speed(1.0f),
      moveDelta(zero),

      animate(true),
      render_time(0.f),

      command_line_camera(false),
      print_frame_rate(false),
      avg_render_time(64,1.0),
      avg_frame_time(64,1.0),
      avg_mrayps(64,1.0),
      print_camera(false),

      debug0(0),
      debug1(0),
      debug2(0),
      debug3(0),

      iflags_coherent(RTC_RAY_QUERY_FLAG_COHERENT),
      iflags_incoherent(RTC_RAY_QUERY_FLAG_INCOHERENT)
  {
    /* only a single instance of this class is supported */
    assert(instance == nullptr);
    instance = this;

    /* for best performance set FTZ and DAZ flags in MXCSR control and status register */
    _MM_SET_FLUSH_ZERO_MODE(_MM_FLUSH_ZERO_ON);
    _MM_SET_DENORMALS_ZERO_MODE(_MM_DENORMALS_ZERO_ON);

    registerOption("c", [this] (Ref<ParseStream> cin, const FileName& path) {
        FileName file = path + cin->getFileName();
        parseCommandLine(new ParseStream(new LineCommentFilter(file, "#")), file.path());
      }, "-c <filename>: parses command line option from <filename>");

    registerOption("o", [this] (Ref<ParseStream> cin, const FileName& path) {
        outputImageFilename = cin->getFileName();
        interactive = false;
      }, "-o <filename>: output image filename");

    registerOption("compare", [this] (Ref<ParseStream> cin, const FileName& path) {
        referenceImageFilename = cin->getFileName();
        interactive = false;
      }, "--compare <filename>: reference image to compare against");

    registerOption("compare-threshold", [this] (Ref<ParseStream> cin, const FileName& path) {
        referenceImageThreshold = cin->getFloat();
      }, "--compare-threshold <float>: threshold in number of wrong pixels when image is considered wrong");

    registerOption("frames", [this] (Ref<ParseStream> cin, const FileName& path) {
        numFrames = cin->getInt();
      }, "--frames <int>: number of frames to render in compare or output mode");

    /* camera settings */
    registerOption("vp", [this] (Ref<ParseStream> cin, const FileName& path) {
        camera.from = cin->getVec3fa();
        command_line_camera = true;
      }, "--vp <float> <float> <float>: camera position");

    registerOption("vi", [this] (Ref<ParseStream> cin, const FileName& path) {
        camera.to = cin->getVec3fa();
        command_line_camera = true;
      }, "--vi <float> <float> <float>: camera lookat position");

    registerOption("vd", [this] (Ref<ParseStream> cin, const FileName& path) {
        camera.to = camera.from + cin->getVec3fa();
        command_line_camera = true;
      }, "--vd <float> <float> <float>: camera direction vector");

    registerOption("vu", [this] (Ref<ParseStream> cin, const FileName& path) {
        camera.up = cin->getVec3fa();
        command_line_camera = true;
      }, "--vu <float> <float> <float>: camera up vector");

    registerOption("fov", [this] (Ref<ParseStream> cin, const FileName& path) {
        camera.fov = cin->getFloat();
        command_line_camera = true;
      }, "--fov <float>: vertical field of view");

    registerOption("lefthanded", [this] (Ref<ParseStream> cin, const FileName& path) {
        camera.handedness = Camera::LEFT_HANDED;
      }, "--lefthanded: use left handed coordinates");

    registerOption("righthanded", [this] (Ref<ParseStream> cin, const FileName& path) {
        camera.handedness = Camera::RIGHT_HANDED;
      }, "--righthanded: use right handed coordinates");

    /* framebuffer settings */
    registerOption("size", [this] (Ref<ParseStream> cin, const FileName& path) {
        width = cin->getInt();
        height = cin->getInt();
      }, "--size <width> <height>: sets image size");

    registerOption("fullscreen", [this] (Ref<ParseStream> cin, const FileName& path) {
        fullscreen = true;
      }, "--fullscreen: starts in fullscreen mode");

    registerOption("print-frame-rate", [this] (Ref<ParseStream> cin, const FileName& path) {
        print_frame_rate = true;
      }, "--print-frame-rate: prints framerate for each frame on console");

     registerOption("print-camera", [this] (Ref<ParseStream> cin, const FileName& path) {
         print_camera = true;
      }, "--print-camera: prints camera for each frame on console");

     registerOption("debug0", [this] (Ref<ParseStream> cin, const FileName& path) {
         debug0 = cin->getInt();
       }, "--debug0: sets internal debugging value");

     registerOption("debug1", [this] (Ref<ParseStream> cin, const FileName& path) {
         debug1 = cin->getInt();
       }, "--debug1: sets internal debugging value");

     registerOption("debug2", [this] (Ref<ParseStream> cin, const FileName& path) {
         debug2 = cin->getInt();
       }, "--debug2: sets internal debugging value");

     registerOption("debug3", [this] (Ref<ParseStream> cin, const FileName& path) {
         debug3 = cin->getInt();
       }, "--debug3: sets internal debugging value");

     registerOption("time", [this] (Ref<ParseStream> cin, const FileName& path) {
         g_motion_blur = false;
         animate = false;
         render_time = cin->getFloat();
         g_debug = render_time;
       }, "--time: sets time for motion blur");

    registerOption("coherent", [this] (Ref<ParseStream> cin, const FileName& path) {
        g_iflags_coherent   = iflags_coherent   = RTC_RAY_QUERY_FLAG_COHERENT;
        g_iflags_incoherent = iflags_incoherent = RTC_RAY_QUERY_FLAG_COHERENT;
      }, "--coherent: force using RTC_RAY_QUERY_FLAG_COHERENT hint when tracing rays");

    registerOption("incoherent", [this] (Ref<ParseStream> cin, const FileName& path) {
        g_iflags_coherent   = iflags_coherent   = RTC_RAY_QUERY_FLAG_INCOHERENT;
        g_iflags_incoherent = iflags_incoherent = RTC_RAY_QUERY_FLAG_INCOHERENT;
      }, "--incoherent: force using RTC_RAY_QUERY_FLAG_INCOHERENT hint when tracing rays");

#if defined(EMBREE_SYCL_TUTORIAL)
    registerOption("jit-cache", [this] (Ref<ParseStream> cin, const FileName& path) {
         jit_cache = cin->getInt();
       }, "--jit-cache <0/1>: enabled (1) or disables (0) JIT caching");
#endif
  }